

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.h
# Opt level: O0

SEARCH_METHODS
av1_get_default_mv_search_method(MACROBLOCK *x,MV_SPEED_FEATURES *mv_sf,BLOCK_SIZE bsize)

{
  byte bVar1;
  bool bVar2;
  byte in_DL;
  SEARCH_METHODS *in_RSI;
  long in_RDI;
  _Bool use_faster_search_method;
  int qband;
  int min_dim;
  int sf_blk_search_method;
  SEARCH_METHODS search_method;
  SEARCH_METHODS local_12;
  
  local_12 = *in_RSI;
  if (block_size_wide[in_DL] < block_size_high[in_DL]) {
    bVar1 = block_size_wide[in_DL];
  }
  else {
    bVar1 = block_size_high[in_DL];
  }
  if ((((*(int *)(in_RSI + 4) != 1) || (bVar2 = true, bVar1 < 0x20)) &&
      (bVar2 = false, 1 < *(int *)(in_RSI + 4))) &&
     ((bVar2 = false, 0xf < bVar1 && (bVar2 = false, *(uint *)(in_RDI + 0x15d60) < 4)))) {
    bVar2 = *(int *)(in_RDI + 0x4208) >> 6 < 3;
  }
  if (bVar2) {
    local_12 = av1_get_faster_search_method(local_12);
  }
  return local_12;
}

Assistant:

static inline SEARCH_METHODS av1_get_default_mv_search_method(
    const MACROBLOCK *x, const MV_SPEED_FEATURES *mv_sf, BLOCK_SIZE bsize) {
  SEARCH_METHODS search_method = mv_sf->search_method;
  const int sf_blk_search_method = mv_sf->use_bsize_dependent_search_method;
  const int min_dim = AOMMIN(block_size_wide[bsize], block_size_high[bsize]);
  const int qband = x->qindex >> (QINDEX_BITS - 2);
  const bool use_faster_search_method =
      (sf_blk_search_method == 1 && min_dim >= 32) ||
      (sf_blk_search_method >= 2 && min_dim >= 16 &&
       x->content_state_sb.source_sad_nonrd <= kMedSad && qband < 3);

  if (use_faster_search_method) {
    search_method = av1_get_faster_search_method(search_method);
  }
  return search_method;
}